

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O2

MethodPrototypeSymbol *
slang::ast::MethodPrototypeSymbol::fromSyntax(Scope *scope,ExternInterfaceMethodSyntax *syntax)

{
  byte *pbVar1;
  MethodPrototypeSymbol *pMVar2;
  SourceRange sourceRange;
  
  pMVar2 = createExternIfaceMethod<slang::syntax::ExternInterfaceMethodSyntax>(scope,syntax);
  if ((syntax->forkJoin).info != (Info *)0x0) {
    if (pMVar2->subroutineKind == Function) {
      sourceRange = parsing::Token::range(&syntax->forkJoin);
      Scope::addDiag(scope,(DiagCode)0x3a0006,sourceRange);
    }
    else {
      pbVar1 = (byte *)((long)&(pMVar2->flags).m_bits + 1);
      *pbVar1 = *pbVar1 | 8;
    }
  }
  return pMVar2;
}

Assistant:

MethodPrototypeSymbol& MethodPrototypeSymbol::fromSyntax(
    const Scope& scope, const ExternInterfaceMethodSyntax& syntax) {

    auto& result = createExternIfaceMethod(scope, syntax);
    if (syntax.forkJoin) {
        if (result.subroutineKind == SubroutineKind::Function)
            scope.addDiag(diag::ExternFuncForkJoin, syntax.forkJoin.range());
        else
            result.flags |= MethodFlags::ForkJoin;
    }

    return result;
}